

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAcurv.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChNodeFEAcurv::VariablesQbIncrementPosition(ChNodeFEAcurv *this,double step)

{
  double dVar1;
  double dVar2;
  ChVector<double> new_ryy_dt;
  ChVector<double> new_rxx_dt;
  ChVector<double> new_rzz_dt;
  ChVector<double> local_b0;
  ChVector<double> local_98;
  double local_80 [3];
  ChVector<double> *local_68;
  undefined8 local_60;
  double local_50;
  ChVector<double> local_48;
  ChVector<double> local_30;
  
  ChVariables::Get_qb((ChVectorRef *)&local_b0,
                      *(ChVariables **)&(this->super_ChNodeFEAbase).field_0x18);
  local_80[0] = local_b0.m_data[0];
  local_80[1] = 1.48219693752374e-323;
  local_60 = 0;
  local_50 = local_b0.m_data[1];
  local_68 = &local_b0;
  if (2 < (long)local_b0.m_data[1]) {
    ChVector<double>::
    ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
              (&local_98,
               (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                *)local_80,(type *)0x0);
    ChVariables::Get_qb((ChVectorRef *)&local_48,
                        *(ChVariables **)&(this->super_ChNodeFEAbase).field_0x18);
    local_80[0] = (double)((long)local_48.m_data[0] + 0x18);
    local_80[1] = 1.48219693752374e-323;
    local_60 = 3;
    local_50 = local_48.m_data[1];
    local_68 = &local_48;
    if (5 < (long)local_48.m_data[1]) {
      ChVector<double>::
      ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
                (&local_b0,
                 (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                  *)local_80,(type *)0x0);
      ChVariables::Get_qb((ChVectorRef *)&local_30,
                          *(ChVariables **)&(this->super_ChNodeFEAbase).field_0x18);
      local_80[0] = (double)((long)local_30.m_data[0] + 0x30);
      local_80[1] = 1.48219693752374e-323;
      local_60 = 6;
      local_50 = local_30.m_data[1];
      local_68 = &local_30;
      if (8 < (long)local_30.m_data[1]) {
        ChVector<double>::
        ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
                  (&local_48,
                   (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                    *)local_80,(type *)0x0);
        dVar1 = *(double *)&this->field_0x30;
        dVar2 = *(double *)&this->field_0x28;
        *(double *)&(this->super_ChNodeFEAbase).field_0x20 =
             step * local_98.m_data[0] + *(double *)&(this->super_ChNodeFEAbase).field_0x20;
        *(double *)&this->field_0x28 = step * local_98.m_data[1] + dVar2;
        *(double *)&this->field_0x30 = step * local_98.m_data[2] + dVar1;
        dVar1 = (this->m_ryy).m_data[2];
        dVar2 = (this->m_ryy).m_data[1];
        (this->m_ryy).m_data[0] = step * local_b0.m_data[0] + (this->m_ryy).m_data[0];
        (this->m_ryy).m_data[1] = step * local_b0.m_data[1] + dVar2;
        (this->m_ryy).m_data[2] = step * local_b0.m_data[2] + dVar1;
        dVar1 = (this->m_rzz).m_data[2];
        dVar2 = (this->m_rzz).m_data[1];
        (this->m_rzz).m_data[0] = step * local_48.m_data[0] + (this->m_rzz).m_data[0];
        (this->m_rzz).m_data[1] = step * local_48.m_data[1] + dVar2;
        (this->m_rzz).m_data[2] = step * local_48.m_data[2] + dVar1;
        return;
      }
    }
  }
  local_80[1] = 1.48219693752374e-323;
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChNodeFEAcurv::VariablesQbIncrementPosition(double step) {
    ChVector<> new_rxx_dt(m_variables->Get_qb().segment(0, 3));
    ChVector<> new_ryy_dt(m_variables->Get_qb().segment(3, 3));
    ChVector<> new_rzz_dt(m_variables->Get_qb().segment(6, 3));
    m_rxx = m_rxx + new_rxx_dt * step;
    m_ryy = m_ryy + new_ryy_dt * step;
    m_rzz = m_rzz + new_rzz_dt * step;
}